

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O2

void __thiscall
t_swift_generator::generate_swift_struct_hashable_extension
          (t_swift_generator *this,ostream *out,t_struct *tstruct,bool is_private)

{
  t_field *ptVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  pointer pptVar4;
  undefined3 in_register_00000009;
  char *pcVar5;
  pointer pptVar6;
  char *pcVar7;
  string visibility;
  string local_50;
  
  pcVar5 = "fileprivate";
  if ((this->gen_cocoa_ & 1U) != 0) {
    pcVar5 = "private";
  }
  pcVar7 = "public";
  if (CONCAT31(in_register_00000009,is_private) != 0) {
    pcVar7 = pcVar5;
  }
  std::__cxx11::string::string((string *)&visibility,pcVar7,(allocator *)&local_50);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"extension ");
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var,iVar2));
  std::operator<<(poVar3," : Hashable");
  block_open(this,out);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,(string *)&visibility);
  std::operator<<(poVar3," func hash(into hasher: inout Hasher)");
  block_open(this,out);
  pptVar6 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pptVar4 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (pptVar6 != pptVar4) {
    if (tstruct->is_union_ == false) {
      for (; pptVar6 != pptVar4; pptVar6 = pptVar6 + 1) {
        ptVar1 = *pptVar6;
        poVar3 = t_generator::indent((t_generator *)this,out);
        poVar3 = std::operator<<(poVar3,"hasher.combine(");
        maybe_escape_identifier(&local_50,this,&ptVar1->name_);
        poVar3 = std::operator<<(poVar3,(string *)&local_50);
        poVar3 = std::operator<<(poVar3,")");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_50);
        pptVar4 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
    }
    else {
      poVar3 = t_generator::indent((t_generator *)this,out);
      poVar3 = std::operator<<(poVar3,"switch self {");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      for (pptVar6 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          pptVar6 !=
          (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_finish; pptVar6 = pptVar6 + 1) {
        ptVar1 = *pptVar6;
        poVar3 = t_generator::indent((t_generator *)this,out);
        poVar3 = std::operator<<(poVar3,"case .");
        poVar3 = std::operator<<(poVar3,(string *)&ptVar1->name_);
        poVar3 = std::operator<<(poVar3,"(let val): hasher.combine(val)");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      }
      poVar3 = t_generator::indent((t_generator *)this,out);
      poVar3 = std::operator<<(poVar3,"}");
      poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    }
  }
  block_close(this,out,true);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  block_close(this,out,true);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&visibility);
  return;
}

Assistant:

void t_swift_generator::generate_swift_struct_hashable_extension(ostream& out,
                                                                 t_struct* tstruct,
                                                                 bool is_private) {

  string visibility = is_private ? (gen_cocoa_ ? "private" : "fileprivate") : "public";
  indent(out) << "extension " << tstruct->get_name() << " : Hashable";
  block_open(out);
  out << endl;
  indent(out) << visibility << " func hash(into hasher: inout Hasher)";
  block_open(out);

  const vector<t_field*>& members = tstruct->get_members();
  vector<t_field*>::const_iterator m_iter;

  if (!members.empty()) {
    if (!tstruct->is_union()) {
      for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
        t_field* tfield = *m_iter;
        indent(out) << "hasher.combine(" << maybe_escape_identifier(tfield->get_name()) << ")" << endl;
      }
    } else {
      indent(out) << "switch self {" << endl;
      for (m_iter = members.begin(); m_iter != members.end(); m_iter++) {
        t_field *tfield = *m_iter;
        indent(out) << "case ." << tfield->get_name() << "(let val): hasher.combine(val)" << endl;
      }
      indent(out) << "}" << endl << endl;
    }
  }
  block_close(out);
  out << endl;
  block_close(out);
  out << endl;
}